

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void build_fire(CHAR_DATA *ch,int dur)

{
  ulong uVar1;
  char *pcVar2;
  bool fInvis;
  int iVar3;
  int iVar4;
  CHAR_DATA *ch_00;
  OBJ_DATA *obj;
  CProficiencies *profname;
  short in_SI;
  char_data *in_RDI;
  OBJ_DATA *fire;
  string buffer;
  undefined1 in_stack_000000e0 [16];
  undefined1 in_stack_000000f0 [16];
  void *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  CHAR_DATA *in_stack_fffffffffffffe88;
  CProficiencies *in_stack_fffffffffffffe90;
  OBJ_DATA *this;
  CHAR_DATA *in_stack_fffffffffffffe98;
  char *local_128;
  v9 local_120 [3];
  char *args_1;
  string local_108 [36];
  short local_e4;
  char_data *local_e0;
  undefined4 in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 local_b8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*> *local_b0
  ;
  char **local_a8;
  CHAR_DATA *local_a0;
  char **local_98;
  v9 *local_90;
  undefined1 local_88 [16];
  string *local_78;
  char *local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char **local_48;
  CHAR_DATA *pCStack_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*> *local_38
  ;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*> *local_28
  ;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*> *local_10
  ;
  char *local_8;
  
  local_e0 = in_RDI;
  local_e4 = in_SI;
  iVar3 = number_percent();
  char_data::Profs(local_e0);
  iVar4 = CProficiencies::GetProf(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
  if (iVar4 * 3 + 0x3c < iVar3) {
    act((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
        (void *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
        in_stack_fffffffffffffe78,0);
    act((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
        (void *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
        in_stack_fffffffffffffe78,0);
    char_data::Profs(local_e0);
    CProficiencies::CheckImprove
              (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84
              );
  }
  else {
    local_68 = &stack0xfffffffffffffee8;
    local_70 = 
    "{}The spark is caught by some dried brush, and it quickly erupts into a blazing campfire!{}";
    local_60 = 
    "{}The spark is caught by some dried brush, and it quickly erupts into a blazing campfire!{}";
    args_1 = 
    "{}The spark is caught by some dried brush, and it quickly erupts into a blazing campfire!{}";
    local_58 = local_68;
    ch_00 = (CHAR_DATA *)std::char_traits<char>::length((char_type *)0x7accc1);
    local_8 = local_70;
    _local_120 = get_char_color(in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
    local_128 = END_COLOR(in_stack_fffffffffffffe88);
    local_78 = local_108;
    local_90 = local_120;
    local_98 = &local_128;
    local_50 = local_88;
    local_a8 = (char **)args_1;
    local_a0 = ch_00;
    local_48 = (char **)args_1;
    pCStack_40 = ch_00;
    fmt::v9::make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,char*&>
              ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*>
                *)&stack0xffffffffffffff28,local_90,local_98,(char **)args_1);
    local_30 = &local_b8;
    local_20 = 0xcc;
    local_b8 = 0xcc;
    local_38 = (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*>
                *)&stack0xffffffffffffff28;
    local_28 = (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*>
                *)&stack0xffffffffffffff28;
    local_18 = local_30;
    local_10 = (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*>
                *)&stack0xffffffffffffff28;
    local_b0 = (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*>
                *)&stack0xffffffffffffff28;
    fmt::v9::vformat_abi_cxx11_((string_view)in_stack_000000f0,(format_args)in_stack_000000e0);
    std::__cxx11::string::c_str();
    act((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
        (void *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
        in_stack_fffffffffffffe78,0);
    get_obj_index((int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    obj = create_object((OBJ_INDEX_DATA *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    this = obj;
    profname = char_data::Profs(local_e0);
    iVar4 = CProficiencies::GetProf((CProficiencies *)this,(char *)profname);
    obj->value[0] = iVar4 + 1;
    obj->timer = local_e4;
    obj_to_room(obj,local_e0->in_room);
    pcVar2 = _local_120;
    uVar1 = (ulong)_local_120 >> 0x20;
    iVar3 = (int)uVar1;
    fInvis = SUB81((ulong)pcVar2 >> 0x18,0);
    _local_120 = pcVar2;
    add_prof_affect(ch_00,args_1,iVar3,fInvis);
    char_data::Profs(local_e0);
    CProficiencies::CheckImprove((CProficiencies *)this,(char *)profname,iVar4);
    std::__cxx11::string::~string(local_108);
  }
  return;
}

Assistant:

void build_fire(CHAR_DATA *ch, int dur)
{
	if (number_percent() > 60 + ch->Profs()->GetProf("firestarting") * 3)
	{
		act("$n's fire dies out despite $s best attempts to kindle it.", ch, 0, 0, TO_ROOM);
		act("Your fire dies out despite your best attempts to kindle it.", ch, 0, 0, TO_CHAR);
		ch->Profs()->CheckImprove("firestarting", 300);
		return;
	}

	auto buffer = fmt::format("{}The spark is caught by some dried brush, and it quickly erupts into a blazing campfire!{}",
		get_char_color(ch, "lightred"),
		END_COLOR(ch));
	act(buffer.c_str(), ch, 0, 0, TO_ALL);

	auto fire = create_object(get_obj_index(OBJ_VNUM_CAMPFIRE), ch->level);
	fire->value[0] = ch->Profs()->GetProf("firestarting") + 1;
	fire->timer = dur;
	obj_to_room(fire, ch->in_room);
	add_prof_affect(ch, "firestarting", dur);
	ch->Profs()->CheckImprove("firestarting", 250);
}